

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

void __thiscall
Imath_3_2::Frustum<float>::setExc
          (Frustum<float> *this,float nearPlane,float farPlane,float fovx,float fovy,float aspect)

{
  domain_error *this_00;
  long in_RDI;
  float in_XMM0_Da;
  double dVar1;
  undefined4 in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float two;
  
  if (((in_XMM2_Da != 0.0) || (NAN(in_XMM2_Da))) && ((in_XMM3_Da != 0.0 || (NAN(in_XMM3_Da))))) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this_00,"fovx and fovy cannot both be non-zero.");
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if ((in_XMM2_Da != 0.0) || (NAN(in_XMM2_Da))) {
    dVar1 = std::tan((double)(ulong)(uint)(in_XMM2_Da / 2.0));
    *(float *)(in_RDI + 0x14) = in_XMM0_Da * SUB84(dVar1,0);
    *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x14) ^ 0x80000000;
    *(float *)(in_RDI + 0x18) =
         ((*(float *)(in_RDI + 0x14) - *(float *)(in_RDI + 0x10)) / in_XMM4_Da) / 2.0;
    *(uint *)(in_RDI + 0x1c) = *(uint *)(in_RDI + 0x18) ^ 0x80000000;
  }
  else {
    dVar1 = std::tan((double)(ulong)(uint)(in_XMM3_Da / 2.0));
    *(float *)(in_RDI + 0x18) = in_XMM0_Da * SUB84(dVar1,0);
    *(uint *)(in_RDI + 0x1c) = *(uint *)(in_RDI + 0x18) ^ 0x80000000;
    *(float *)(in_RDI + 0x14) =
         ((*(float *)(in_RDI + 0x18) - *(float *)(in_RDI + 0x1c)) * in_XMM4_Da) / 2.0;
    *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x14) ^ 0x80000000;
  }
  *(float *)(in_RDI + 8) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0xc) = in_XMM1_Da;
  *(undefined1 *)(in_RDI + 0x20) = 0;
  return;
}

Assistant:

inline void
Frustum<T>::setExc (T nearPlane, T farPlane, T fovx, T fovy, T aspect)
{
    if (fovx != T (0) && fovy != T (0))
        throw std::domain_error ("fovx and fovy cannot both be non-zero.");

    const T two = static_cast<T> (2);

    if (fovx != T (0))
    {
        _right  = nearPlane * std::tan (fovx / two);
        _left   = -_right;
        _top    = ((_right - _left) / aspect) / two;
        _bottom = -_top;
    }
    else
    {
        _top    = nearPlane * std::tan (fovy / two);
        _bottom = -_top;
        _right  = (_top - _bottom) * aspect / two;
        _left   = -_right;
    }
    _nearPlane    = nearPlane;
    _farPlane     = farPlane;
    _orthographic = false;
}